

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsOpaqueType(Instruction *this)

{
  Op opcode;
  IRContext *this_00;
  pointer pOVar1;
  uint **ppuVar2;
  char cVar3;
  bool bVar4;
  uint32_t uVar5;
  uint **ppuVar6;
  pointer pOVar7;
  undefined1 local_79;
  undefined1 **local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  uint *local_50;
  undefined1 *local_48;
  Instruction *pIStack_40;
  code *local_38;
  code *pcStack_30;
  
  while (opcode = this->opcode_, opcode == OpTypeArray) {
    uVar5 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar5 = (uint)this->has_result_id_;
    }
    uVar5 = GetSingleWordOperand(this,uVar5);
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this = analysis::DefUseManager::GetDef
                     ((this_00->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar5);
  }
  if (opcode == OpTypeRuntimeArray) {
    local_79 = 1;
  }
  else {
    if (opcode != OpTypeStruct) {
      bVar4 = spvOpcodeIsBaseOpaqueType(opcode);
      return bVar4;
    }
    local_48 = &local_79;
    local_79 = 0;
    local_78 = &local_48;
    pcStack_30 = std::
                 _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:737:22)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:737:22)>
               ::_M_manager;
    uStack_70 = 0;
    pcStack_60 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:884:22)>
               ::_M_manager;
    pOVar7 = (this->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (this->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIStack_40 = this;
    if (pOVar7 != pOVar1) {
      do {
        if ((pOVar7->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
          ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar6 = &(pOVar7->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar6 = ppuVar2;
          }
          local_50 = *ppuVar6;
          if (local_68 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar3 = (*pcStack_60)(&local_78,&local_50);
          if (cVar3 == '\0') break;
        }
        pOVar7 = pOVar7 + 1;
      } while (pOVar7 != pOVar1);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
  }
  return (bool)local_79;
}

Assistant:

bool Instruction::IsOpaqueType() const {
  if (opcode() == spv::Op::OpTypeStruct) {
    bool is_opaque = false;
    ForEachInOperand([&is_opaque, this](const uint32_t* op_id) {
      Instruction* type_inst = context()->get_def_use_mgr()->GetDef(*op_id);
      is_opaque |= type_inst->IsOpaqueType();
    });
    return is_opaque;
  } else if (opcode() == spv::Op::OpTypeArray) {
    uint32_t sub_type_id = GetSingleWordInOperand(0);
    Instruction* sub_type_inst =
        context()->get_def_use_mgr()->GetDef(sub_type_id);
    return sub_type_inst->IsOpaqueType();
  } else {
    return opcode() == spv::Op::OpTypeRuntimeArray ||
           spvOpcodeIsBaseOpaqueType(opcode());
  }
}